

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O2

void __thiscall
flatbuffers::go::GoGenerator::GenNativeStructPack
          (GoGenerator *this,StructDef *struct_def,string *code_ptr)

{
  IdlNamer *pIVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pIVar1 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0x11])(&local_48,pIVar1,struct_def);
  std::operator+(&bStack_88,"func (t *",&local_48);
  std::operator+(&local_68,&bStack_88,
                 ") Pack(builder *flatbuffers.Builder) flatbuffers.UOffsetT {\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&bStack_88);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::append((char *)code_ptr);
  (*(pIVar1->super_Namer)._vptr_Namer[0xf])(&local_48,pIVar1,struct_def);
  std::operator+(&bStack_88,"\treturn Create",&local_48);
  std::operator+(&local_68,&bStack_88,"(builder");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&bStack_88);
  std::__cxx11::string::~string((string *)&local_48);
  StructPackArgs(this,struct_def,"",code_ptr);
  std::__cxx11::string::append((char *)code_ptr);
  std::__cxx11::string::append((char *)code_ptr);
  return;
}

Assistant:

void GenNativeStructPack(const StructDef &struct_def, std::string *code_ptr) {
    std::string &code = *code_ptr;

    code += "func (t *" + NativeName(struct_def) +
            ") Pack(builder *flatbuffers.Builder) flatbuffers.UOffsetT {\n";
    code += "\tif t == nil {\n\t\treturn 0\n\t}\n";
    code += "\treturn Create" + namer_.Type(struct_def) + "(builder";
    StructPackArgs(struct_def, "", code_ptr);
    code += ")\n";
    code += "}\n";
  }